

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O1

void __thiscall spatial_region::fout_tracks(spatial_region *this,double a,int nm)

{
  pointer pcVar1;
  ostream *poVar2;
  double *pdVar3;
  double dVar4;
  string file_name;
  ofstream fout;
  char file_num_pchar [20];
  char local_2a1;
  char *local_2a0;
  long local_298;
  char local_290 [16];
  long local_280;
  long local_278;
  undefined8 local_270;
  long local_268;
  long local_260;
  double local_258;
  double local_250;
  undefined1 *local_248;
  filebuf local_240 [8];
  undefined1 local_238 [232];
  ios_base local_150 [264];
  char local_48 [24];
  
  if (0 < this->nx) {
    dVar4 = (double)nm;
    local_268 = _VTT;
    local_270 = ___throw_bad_array_new_length;
    local_280 = 0;
    local_258 = dVar4;
    local_250 = a;
    do {
      if (0 < this->ny) {
        local_278 = 0;
        do {
          if (0 < this->nz) {
            local_260 = 0;
            do {
              for (pdVar3 = &((this->cp).p._M_t.
                              super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t
                              .super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                              super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_280]
                              [local_278][local_260].pl.head)->x; pdVar3 != (double *)0x0;
                  pdVar3 = (double *)pdVar3[0xb]) {
                if (((*(int *)(pdVar3 + 10) != 0) && (dVar4 <= *pdVar3)) &&
                   (*pdVar3 < (double)(this->nx - nm))) {
                  local_2a0 = local_290;
                  local_298 = 0;
                  local_290[0] = '\0';
                  local_248 = local_238;
                  pcVar1 = (this->data_folder)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_248,pcVar1,
                             pcVar1 + (this->data_folder)._M_string_length);
                  std::__cxx11::string::append((char *)&local_248);
                  std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_248);
                  if (local_248 != local_238) {
                    operator_delete(local_248);
                  }
                  sprintf(local_48,"%g",pdVar3[8]);
                  local_248 = local_238;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_248,local_2a0,local_2a0 + local_298);
                  std::__cxx11::string::append((char *)&local_248);
                  std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_248);
                  if (local_248 != local_238) {
                    operator_delete(local_248);
                  }
                  local_248 = local_238;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_248,local_2a0,local_2a0 + local_298);
                  std::__cxx11::string::append((char *)&local_248);
                  std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_248);
                  if (local_248 != local_238) {
                    operator_delete(local_248);
                  }
                  sprintf(local_48,"%d",(ulong)*(uint *)(pdVar3 + 10));
                  local_248 = local_238;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_248,local_2a0,local_2a0 + local_298);
                  std::__cxx11::string::append((char *)&local_248);
                  std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_248);
                  if (local_248 != local_238) {
                    operator_delete(local_248);
                  }
                  std::ofstream::ofstream((string *)&local_248,local_2a0,_S_app);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[7]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>
                                     ((*pdVar3 * this->dx * 0.5) / 3.141592653589793 + local_250);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>
                                     ((pdVar3[1] * this->dy * 0.5) / 3.141592653589793);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>
                                     ((pdVar3[2] * this->dz * 0.5) / 3.141592653589793);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[3]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[4]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[5]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[6]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  poVar2 = std::ostream::_M_insert<double>(pdVar3[9]);
                  local_2a1 = '\n';
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_2a1,1);
                  local_248 = (undefined1 *)local_268;
                  *(undefined8 *)(local_240 + *(long *)(local_268 + -0x18) + -8) = local_270;
                  std::filebuf::~filebuf(local_240);
                  std::ios_base::~ios_base(local_150);
                  dVar4 = local_258;
                  if (local_2a0 != local_290) {
                    operator_delete(local_2a0);
                    dVar4 = local_258;
                  }
                }
              }
              local_260 = local_260 + 1;
            } while (local_260 < this->nz);
          }
          local_278 = local_278 + 1;
        } while (local_278 < this->ny);
      }
      local_280 = local_280 + 1;
    } while (local_280 < this->nx);
  }
  return;
}

Assistant:

void spatial_region::fout_tracks(double a, int nm) {
    for (int i=0;i<nx;i++) {
        for (int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                particle* current;
                current = cp[i][j][k].pl.head;
                while (current!=0) {
                    if (current->trn!=0 && current->x>=nm && current->x<nx-nm) {
                        std::string file_name;
                        char file_num_pchar[20];
                        file_name = spatial_region::data_folder+"/track_";
                        sprintf(file_num_pchar,"%g",current->cmr);
                        file_name = file_name + file_num_pchar;
                        file_name = file_name + "_";
                        sprintf(file_num_pchar,"%d",current->trn);
                        file_name = file_name + file_num_pchar;
                        ofstream fout(file_name.c_str(),ios::app);
                        #ifdef QUILL_NOQED
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<< 0.0 <<'\n';
                        #else
                        fout<<current->q<<'\n'<<current->x*dx/2/PI+a<<'\n'<<current->y*dy/2/PI<<'\n'<<current->z*dz/2/PI<<'\n'<<current->ux<<'\n'<<current->uy<<'\n'<<current->uz<<'\n'<<current->g<<'\n'<<current->chi<<'\n';
                        #endif
                    }
                    current = current->next;
                }
            }
        }
    }
}